

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  long lVar4;
  ImGuiContext *g;
  long lVar5;
  uint uVar6;
  ImGuiWindow *window;
  long lVar7;
  
  iVar1 = (GImGui->WindowsFocusOrder).Size;
  lVar5 = (long)iVar1;
  uVar6 = iVar1 - 1;
  if (under_this_window != (ImGuiWindow *)0x0) {
    do {
      if (lVar5 < 1) {
        lVar7 = 0xffffffff;
        break;
      }
      lVar7 = lVar5 + -1;
      lVar4 = lVar5 + -1;
      lVar5 = lVar7;
    } while ((GImGui->WindowsFocusOrder).Data[lVar4] != under_this_window);
    if ((int)lVar7 != -1) {
      uVar6 = (int)lVar7 - 1;
    }
  }
  if ((int)uVar6 < 0) {
    window = (ImGuiWindow *)0x0;
  }
  else {
    window = (ImGuiWindow *)0x0;
    lVar5 = (ulong)uVar6 + 1;
    do {
      if (iVar1 <= (int)uVar6) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                      ,0x4d7,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar2 = (GImGui->WindowsFocusOrder).Data[lVar5 + -1];
      if (((pIVar2 != ignore_window) && (pIVar2->WasActive == true)) &&
         ((~pIVar2->Flags & 0x40200U) != 0 && (pIVar2->Flags & 0x1000000U) == 0)) {
        window = pIVar2->NavLastChildNavWindow;
        if (pIVar2->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          window = pIVar2;
        }
        break;
      }
      lVar7 = lVar5 + -1;
      bVar3 = 0 < lVar5;
      lVar5 = lVar7;
    } while (lVar7 != 0 && bVar3);
  }
  FocusWindow(window);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}